

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.h
# Opt level: O3

string * __thiscall libsgp4::Tle::ToString_abi_cxx11_(string *__return_storage_ptr__,Tle *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ostream *poVar3;
  stringstream ss;
  string local_1d8;
  DateTime local_1b8;
  stringstream local_1b0 [16];
  long local_1a0;
  undefined8 local_198 [2];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xffffff4f | 0x80;
  *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"Norad Number:         ",0x16);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"Int. Designator:      ",0x16);
  paVar1 = &local_1d8.field_2;
  pcVar2 = (this->int_designator_)._M_dataplus._M_p;
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,pcVar2,pcVar2 + (this->int_designator_)._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1a0,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"Epoch:                ",0x16);
  local_1b8.m_encoded = (this->epoch_).m_encoded;
  DateTime::ToString_abi_cxx11_(&local_1d8,&local_1b8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1a0,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"Orbit Number:         ",0x16);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 8;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"Mean Motion Dt2:      ",0x16);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 0xc;
  poVar3 = std::ostream::_M_insert<double>(this->mean_motion_dt2_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"Mean Motion Ddt6:     ",0x16);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 0xc;
  poVar3 = std::ostream::_M_insert<double>(this->mean_motion_ddt6_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"Eccentricity:         ",0x16);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 0xc;
  poVar3 = std::ostream::_M_insert<double>(this->eccentricity_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"BStar:                ",0x16);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 0xc;
  poVar3 = std::ostream::_M_insert<double>(this->bstar_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"Inclination:          ",0x16);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 0xc;
  poVar3 = std::ostream::_M_insert<double>(this->inclination_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"Right Ascending Node: ",0x16);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 0xc;
  poVar3 = std::ostream::_M_insert<double>(this->right_ascending_node_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"Argument Perigee:     ",0x16);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 0xc;
  poVar3 = std::ostream::_M_insert<double>(this->argument_perigee_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"Mean Anomaly:         ",0x16);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 0xc;
  poVar3 = std::ostream::_M_insert<double>(this->mean_anomaly_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,"Mean Motion:          ",0x16);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 0xc;
  poVar3 = std::ostream::_M_insert<double>(this->mean_motion_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        std::stringstream ss;
        ss << std::right << std::fixed;
        ss << "Norad Number:         " << NoradNumber() << std::endl;
        ss << "Int. Designator:      " << IntDesignator() << std::endl;
        ss << "Epoch:                " << Epoch() << std::endl;
        ss << "Orbit Number:         " << OrbitNumber() << std::endl;
        ss << std::setprecision(8);
        ss << "Mean Motion Dt2:      ";
        ss << std::setw(12) << MeanMotionDt2() << std::endl;
        ss << "Mean Motion Ddt6:     ";
        ss << std::setw(12) << MeanMotionDdt6() << std::endl;
        ss << "Eccentricity:         ";
        ss << std::setw(12) << Eccentricity() << std::endl;
        ss << "BStar:                ";
        ss << std::setw(12) << BStar() << std::endl;
        ss << "Inclination:          ";
        ss << std::setw(12) << Inclination(true) << std::endl;
        ss << "Right Ascending Node: ";
        ss << std::setw(12) << RightAscendingNode(true) << std::endl;
        ss << "Argument Perigee:     ";
        ss << std::setw(12) << ArgumentPerigee(true) << std::endl;
        ss << "Mean Anomaly:         ";
        ss << std::setw(12) << MeanAnomaly(true) << std::endl;
        ss << "Mean Motion:          ";
        ss << std::setw(12) << MeanMotion() << std::endl;
        return ss.str();
    }